

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

uint32_t __thiscall Buffer::CopyAndRemove(Buffer *this,char *out,uint32_t l)

{
  uint16_t uVar1;
  char *__src;
  BufferChain *pBVar2;
  BufferChain *this_00;
  uint32_t uVar3;
  ulong uVar4;
  uint local_34;
  
  uVar4 = 0;
  this_00 = this->m_head;
  local_34 = l;
  while( true ) {
    while( true ) {
      uVar3 = (uint32_t)uVar4;
      if (this_00 == (BufferChain *)0x0) goto LAB_0010593b;
      uVar1 = BufferChain::GetCanReadCount(this_00);
      if (uVar1 != 0) break;
      pBVar2 = this_00->nextpkt;
      (*this->_vptr_Buffer[1])(this,this_00);
      this->m_head = pBVar2;
      this_00 = pBVar2;
    }
    __src = BufferChain::GetReadAddr(this_00);
    if (local_34 < uVar1) break;
    memcpy(out + uVar4,__src,(ulong)uVar1);
    this->len = this->len - (uint)uVar1;
    uVar3 = uVar3 + uVar1;
    uVar4 = (ulong)uVar3;
    pBVar2 = this_00->nextpkt;
    (*this->_vptr_Buffer[1])(this,this_00);
    this->m_head = pBVar2;
    local_34 = local_34 - uVar1;
    this_00 = pBVar2;
    if (local_34 == 0) {
LAB_00105936:
      if (pBVar2 == (BufferChain *)0x0) {
LAB_0010593b:
        this->m_end = (BufferChain *)0x0;
      }
      return uVar3;
    }
  }
  memcpy(out + uVar4,__src,(ulong)local_34);
  uVar3 = uVar3 + local_34;
  this->len = this->len - local_34;
  this_00->read = this_00->read + (short)local_34;
  pBVar2 = this->m_head;
  goto LAB_00105936;
}

Assistant:

uint32_t Buffer::CopyAndRemove(char *out, uint32_t l)
{
    uint32_t ret = 0;
    for(BufferChain* buff = this->m_head; buff != nullptr;)
    {
        uint16_t canReadCount = buff->GetCanReadCount();
        if(canReadCount == 0)
        {
            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;
            continue;
        }

        if(l < canReadCount)
        {
            memcpy(out + ret, buff->GetReadAddr(), l);
            ret += l;
            len -= l;
            buff->read += l;
            break;
        }
        else
        {
            memcpy(out + ret, buff->GetReadAddr(), canReadCount);
            ret += canReadCount;
            l -= canReadCount;
            len -= canReadCount;

            BufferChain* bc = buff->nextpkt;
            Cycle(buff);
            buff = bc;
            m_head = bc;

            if(l == 0)
                break;
        }

    }

    if(m_head == nullptr)
        m_end = nullptr;

    return ret;
}